

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ArrayPtr<const_kj::CidrRange> kj::_::reservedCidrs(void)

{
  int iVar1;
  ArrayPtr<const_kj::CidrRange> AVar2;
  StringPtr pattern;
  StringPtr pattern_00;
  StringPtr pattern_01;
  StringPtr pattern_02;
  StringPtr pattern_03;
  StringPtr pattern_04;
  
  if (reservedCidrs()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&reservedCidrs()::result);
    if (iVar1 != 0) {
      pattern.content.size_ = 0xd;
      pattern.content.ptr = "192.0.0.0/24";
      CidrRange::CidrRange((CidrRange *)reservedCidrs()::result,pattern);
      pattern_00.content.size_ = 0xc;
      pattern_00.content.ptr = "224.0.0.0/4";
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x18),pattern_00);
      pattern_01.content.size_ = 0xc;
      pattern_01.content.ptr = "240.0.0.0/4";
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x30),pattern_01);
      pattern_02.content.size_ = 0x13;
      pattern_02.content.ptr = "255.255.255.255/32";
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x48),pattern_02);
      pattern_03.content.size_ = 10;
      pattern_03.content.ptr = "2001::/23";
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x60),pattern_03);
      pattern_04.content.size_ = 9;
      pattern_04.content.ptr = "ff00::/8";
      CidrRange::CidrRange((CidrRange *)(reservedCidrs()::result + 0x78),pattern_04);
      __cxa_guard_release(&reservedCidrs()::result);
    }
  }
  AVar2.size_ = 6;
  AVar2.ptr = (CidrRange *)reservedCidrs()::result;
  return AVar2;
}

Assistant:

ArrayPtr<const CidrRange> reservedCidrs() {
  // Address ranges reserved by RFCs for specific alternative protocols. These are not considered
  // part of "public", "private", "network", nor "local". But, we will allow apps to explicitly
  // allowlist CIDRs in this range if they really want, because some people actually use these
  // ranges as if they were private ranges.

  static const CidrRange result[] = {
    "192.0.0.0/24"_kj,          // RFC6890 reserved for special protocols
    "224.0.0.0/4"_kj,           // RFC1112 multicast
    "240.0.0.0/4"_kj,           // RFC1112 multicast / reserved for future use
    "255.255.255.255/32"_kj,    // RFC0919 broadcast address

    "2001::/23"_kj,             // RFC2928 reserved for special protocols
    "ff00::/8"_kj,              // RFC4291 multicast
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents result from implicitly
  //   casting to our return type.
  return kj::arrayPtr(result, kj::size(result));
}